

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O2

int LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  CLzmaProb *pCVar7;
  Byte *pBVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  CLzmaProb *pCVar13;
  ulong uVar14;
  ushort *puVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  Byte *pBVar27;
  uint uVar28;
  byte *pbVar29;
  long lVar30;
  uint uVar31;
  UInt32 UVar32;
  short sVar33;
  UInt32 UVar34;
  bool bVar35;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_a0;
  uint local_9c;
  ulong local_78;
  
  UVar34 = p->processedPos;
  uVar6 = p->checkDicSize;
  if (uVar6 == 0) {
    uVar9 = (ulong)((p->prop).dicSize - UVar34);
    uVar20 = p->dicPos;
    local_78 = limit;
    if (uVar9 < limit - uVar20) {
      local_78 = uVar20 + uVar9;
    }
  }
  else {
    uVar20 = p->dicPos;
    local_78 = limit;
  }
  pCVar7 = p->probs_1664;
  UVar32 = p->state;
  local_bc = p->reps[0];
  local_b8 = p->reps[1];
  local_c0 = p->reps[2];
  local_a0 = p->reps[3];
  bVar1 = (p->prop).lp;
  bVar2 = (p->prop).pb;
  bVar3 = (p->prop).lc;
  pBVar8 = p->dic;
  uVar9 = p->dicBufSize;
  pbVar29 = p->buf;
  uVar22 = p->range;
  uVar10 = p->code;
  uVar19 = 0;
  do {
    uVar25 = local_a0;
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar23 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar10 = (uint)bVar23 | uVar10 << 8;
    }
    uVar24 = (UVar34 & ~(-1 << (bVar2 & 0x1f))) * 0x10;
    uVar21 = (ulong)(UVar32 + uVar24);
    uVar5 = pCVar7[uVar21 - 0x100];
    uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
    uVar16 = (ulong)local_bc;
    uVar17 = uVar10 - uVar28;
    if (uVar10 < uVar28) {
      pCVar7[uVar21 - 0x100] = (short)(0x800 - uVar5 >> 5) + uVar5;
      pCVar13 = pCVar7 + 0x140;
      if (UVar34 != 0 || uVar6 != 0) {
        uVar21 = uVar20;
        if (uVar20 == 0) {
          uVar21 = uVar9;
        }
        pCVar13 = pCVar7 + 0x140 +
                  ((((uint)pBVar8[uVar21 - 1] | UVar34 << 8) &
                   (0x100 << (bVar1 & 0x1f)) - (0x100U >> (bVar3 & 0x1f))) << (bVar3 & 0x1f)) * 3;
      }
      if (UVar32 < 7) {
        bVar35 = UVar32 < 3;
        UVar32 = UVar32 - 3;
        if (bVar35) {
          UVar32 = 0;
        }
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 * 0x100;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar10 = (uint)bVar23 | uVar10 << 8;
        }
        uVar5 = pCVar13[1];
        uVar25 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 - uVar25;
        if (uVar10 < uVar25) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar17 = 2;
          uVar22 = uVar10;
        }
        else {
          uVar25 = uVar28 - uVar25;
          sVar33 = -(uVar5 >> 5);
          uVar17 = 3;
        }
        pCVar13[1] = sVar33 + uVar5;
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar22 = (uint)bVar23 | uVar22 << 8;
        }
        uVar5 = pCVar13[uVar17];
        uVar28 = (uVar25 >> 0xb) * (uint)uVar5;
        uVar10 = uVar17 * 2;
        uVar24 = uVar22 - uVar28;
        if (uVar22 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar22;
        }
        else {
          uVar28 = uVar25 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        pCVar13[uVar17] = sVar33 + uVar5;
        uVar5 = pCVar13[uVar10];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        uVar17 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 * 2;
        uVar25 = uVar24 - uVar17;
        if (uVar24 < uVar17) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar25 = uVar24;
        }
        else {
          uVar17 = uVar28 - uVar17;
          sVar33 = -(uVar5 >> 5);
          uVar22 = uVar22 | 1;
        }
        pCVar13[uVar10] = sVar33 + uVar5;
        uVar5 = pCVar13[uVar22];
        if (uVar17 < 0x1000000) {
          uVar17 = uVar17 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar25 = (uint)bVar23 | uVar25 << 8;
        }
        uVar28 = (uVar17 >> 0xb) * (uint)uVar5;
        uVar10 = uVar22 * 2;
        uVar24 = uVar25 - uVar28;
        if (uVar25 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar25;
        }
        else {
          uVar28 = uVar17 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        pCVar13[uVar22] = sVar33 + uVar5;
        uVar5 = pCVar13[uVar10];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        uVar17 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 * 2;
        uVar25 = uVar24 - uVar17;
        if (uVar24 < uVar17) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar25 = uVar24;
        }
        else {
          uVar17 = uVar28 - uVar17;
          sVar33 = -(uVar5 >> 5);
          uVar22 = uVar22 | 1;
        }
        pCVar13[uVar10] = sVar33 + uVar5;
        uVar5 = pCVar13[uVar22];
        if (uVar17 < 0x1000000) {
          uVar17 = uVar17 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar25 = (uint)bVar23 | uVar25 << 8;
        }
        uVar28 = (uVar17 >> 0xb) * (uint)uVar5;
        uVar10 = uVar22 * 2;
        uVar24 = uVar25 - uVar28;
        if (uVar25 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar25;
        }
        else {
          uVar28 = uVar17 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        pCVar13[uVar22] = sVar33 + uVar5;
        uVar5 = pCVar13[uVar10];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        uVar18 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar25 = uVar10 * 2;
        uVar17 = uVar24 - uVar18;
        if (uVar24 < uVar18) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar17 = uVar24;
        }
        else {
          uVar18 = uVar28 - uVar18;
          sVar33 = -(uVar5 >> 5);
          uVar25 = uVar25 | 1;
        }
        pCVar13[uVar10] = sVar33 + uVar5;
        uVar5 = pCVar13[uVar25];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar17 = (uint)bVar23 | uVar17 << 8;
        }
        uVar22 = (uVar18 >> 0xb) * (uint)uVar5;
        bVar23 = (char)uVar25 * '\x02';
        uVar10 = uVar17 - uVar22;
        if (uVar17 < uVar22) {
          pCVar13[uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar10 = uVar17;
        }
        else {
          uVar22 = uVar18 - uVar22;
          pCVar13[uVar25] = uVar5 - (uVar5 >> 5);
          bVar23 = bVar23 | 1;
        }
      }
      else {
        uVar21 = 0;
        if (uVar20 < uVar16) {
          uVar21 = uVar9;
        }
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 * 0x100;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar10 = (uint)bVar23 | uVar10 << 8;
        }
        bVar23 = pBVar8[uVar21 + (uVar20 - uVar16)];
        uVar17 = (uint)bVar23 * 2 & 0x100;
        uVar5 = pCVar13[(ulong)uVar17 + 0x101];
        uVar25 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 - uVar25;
        if (uVar10 < uVar25) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          iVar12 = 2;
          uVar22 = uVar10;
          uVar10 = uVar17 ^ 0x100;
        }
        else {
          uVar25 = uVar28 - uVar25;
          sVar33 = -(uVar5 >> 5);
          iVar12 = 3;
          uVar10 = uVar17;
        }
        pCVar13[(ulong)uVar17 + 0x101] = sVar33 + uVar5;
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 << 8;
          bVar4 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar22 = (uint)bVar4 | uVar22 << 8;
        }
        uVar18 = (uint)bVar23 * 4 & uVar10;
        uVar31 = uVar10 + iVar12 + uVar18;
        uVar5 = pCVar13[uVar31];
        uVar28 = (uVar25 >> 0xb) * (uint)uVar5;
        uVar17 = iVar12 * 2;
        uVar24 = uVar22 - uVar28;
        if (uVar22 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar18 = uVar18 ^ uVar10;
          uVar24 = uVar22;
        }
        else {
          uVar28 = uVar25 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar17 = uVar17 | 1;
        }
        pCVar13[uVar31] = sVar33 + uVar5;
        uVar22 = (uint)bVar23 * 8 & uVar18;
        uVar10 = uVar18 + uVar17 + uVar22;
        uVar5 = pCVar13[uVar10];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar4 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar24 = (uint)bVar4 | uVar24 << 8;
        }
        uVar31 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar17 = uVar17 * 2;
        uVar25 = uVar24 - uVar31;
        if (uVar24 < uVar31) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar22 = uVar22 ^ uVar18;
          uVar25 = uVar24;
        }
        else {
          uVar31 = uVar28 - uVar31;
          sVar33 = -(uVar5 >> 5);
          uVar17 = uVar17 | 1;
        }
        pCVar13[uVar10] = sVar33 + uVar5;
        uVar24 = (uint)bVar23 << 4 & uVar22;
        uVar10 = uVar22 + uVar17 + uVar24;
        uVar5 = pCVar13[uVar10];
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar4 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar25 = (uint)bVar4 | uVar25 << 8;
        }
        uVar18 = (uVar31 >> 0xb) * (uint)uVar5;
        uVar17 = uVar17 * 2;
        uVar28 = uVar25 - uVar18;
        if (uVar25 < uVar18) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar24 ^ uVar22;
          uVar28 = uVar25;
        }
        else {
          uVar18 = uVar31 - uVar18;
          sVar33 = -(uVar5 >> 5);
          uVar17 = uVar17 | 1;
        }
        pCVar13[uVar10] = sVar33 + uVar5;
        uVar10 = (uint)bVar23 << 5 & uVar24;
        uVar22 = uVar24 + uVar17 + uVar10;
        uVar5 = pCVar13[uVar22];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar4 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar28 = (uint)bVar4 | uVar28 << 8;
        }
        uVar31 = (uVar18 >> 0xb) * (uint)uVar5;
        uVar17 = uVar17 * 2;
        uVar25 = uVar28 - uVar31;
        if (uVar28 < uVar31) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar10 = uVar10 ^ uVar24;
          uVar25 = uVar28;
        }
        else {
          uVar31 = uVar18 - uVar31;
          sVar33 = -(uVar5 >> 5);
          uVar17 = uVar17 | 1;
        }
        pCVar13[uVar22] = sVar33 + uVar5;
        uVar22 = (uint)bVar23 << 6 & uVar10;
        uVar24 = uVar10 + uVar17 + uVar22;
        uVar5 = pCVar13[uVar24];
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar4 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar25 = (uint)bVar4 | uVar25 << 8;
        }
        uVar18 = (uVar31 >> 0xb) * (uint)uVar5;
        uVar17 = uVar17 * 2;
        uVar28 = uVar25 - uVar18;
        if (uVar25 < uVar18) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar22 = uVar22 ^ uVar10;
          uVar28 = uVar25;
        }
        else {
          uVar18 = uVar31 - uVar18;
          sVar33 = -(uVar5 >> 5);
          uVar17 = uVar17 | 1;
        }
        pCVar13[uVar24] = sVar33 + uVar5;
        uVar10 = (uint)bVar23 << 7 & uVar22;
        uVar25 = uVar22 + uVar17 + uVar10;
        uVar5 = pCVar13[uVar25];
        if (uVar18 < 0x1000000) {
          uVar18 = uVar18 << 8;
          bVar4 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar28 = (uint)bVar4 | uVar28 << 8;
        }
        uVar31 = (uVar18 >> 0xb) * (uint)uVar5;
        uVar17 = uVar17 * 2;
        uVar24 = uVar28 - uVar31;
        if (uVar28 < uVar31) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar10 = uVar10 ^ uVar22;
          uVar24 = uVar28;
        }
        else {
          uVar31 = uVar18 - uVar31;
          sVar33 = -(uVar5 >> 5);
          uVar17 = uVar17 | 1;
        }
        pCVar13[uVar25] = sVar33 + uVar5;
        uVar25 = uVar10 + uVar17 + ((uint)bVar23 << 8 & uVar10);
        uVar5 = pCVar13[uVar25];
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        UVar32 = (UVar32 + (uint)(UVar32 < 10) * 3) - 6;
        uVar22 = (uVar31 >> 0xb) * (uint)uVar5;
        bVar23 = (char)uVar17 * '\x02';
        uVar10 = uVar24 - uVar22;
        if (uVar24 < uVar22) {
          pCVar13[uVar25] = (short)(0x800 - uVar5 >> 5) + uVar5;
          uVar10 = uVar24;
        }
        else {
          uVar22 = uVar31 - uVar22;
          pCVar13[uVar25] = uVar5 - (uVar5 >> 5);
          bVar23 = bVar23 | 1;
        }
      }
      pBVar8[uVar20] = bVar23;
LAB_0012b344:
      uVar21 = uVar20 + 1;
      uVar14 = 1;
    }
    else {
      uVar22 = uVar22 - uVar28;
      pCVar7[uVar21 - 0x100] = uVar5 - (uVar5 >> 5);
      if (uVar22 < 0x1000000) {
        uVar22 = uVar22 * 0x100;
        bVar23 = *pbVar29;
        pbVar29 = pbVar29 + 1;
        uVar17 = uVar17 * 0x100 | (uint)bVar23;
      }
      uVar5 = pCVar7[(ulong)UVar32 + 0x10];
      uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
      uVar10 = uVar17 - uVar28;
      if (uVar17 < uVar28) {
        pCVar7[(ulong)UVar32 + 0x10] = (short)(0x800 - uVar5 >> 5) + uVar5;
        UVar32 = UVar32 + 0xc;
        local_9c = local_bc;
        puVar15 = pCVar7 + -0x300;
        uVar18 = local_b8;
      }
      else {
        uVar22 = uVar22 - uVar28;
        pCVar7[(ulong)UVar32 + 0x10] = uVar5 - (uVar5 >> 5);
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 * 0x100;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar10 = (uint)bVar23 | uVar10 * 0x100;
        }
        uVar5 = pCVar7[(ulong)UVar32 + 0x1c];
        uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
        uVar17 = uVar10 - uVar28;
        if (uVar10 < uVar28) {
          pCVar7[(ulong)UVar32 + 0x1c] = (short)(0x800 - uVar5 >> 5) + uVar5;
          if (uVar28 < 0x1000000) {
            uVar28 = uVar28 * 0x100;
            bVar23 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            uVar10 = (uint)bVar23 | uVar10 << 8;
          }
          uVar5 = pCVar7[uVar21 - 0x600];
          uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
          uVar17 = uVar10 - uVar22;
          if (uVar10 < uVar22) {
            pCVar7[uVar21 - 0x600] = (short)(0x800 - uVar5 >> 5) + uVar5;
            uVar21 = 0;
            if (uVar20 < uVar16) {
              uVar21 = uVar9;
            }
            pBVar8[uVar20] = pBVar8[uVar21 + (uVar20 - uVar16)];
            UVar32 = (uint)(6 < UVar32) * 2 + 9;
            goto LAB_0012b344;
          }
          uVar28 = uVar28 - uVar22;
          pCVar7[uVar21 - 0x600] = uVar5 - (uVar5 >> 5);
          uVar18 = local_b8;
        }
        else {
          uVar22 = uVar22 - uVar28;
          pCVar7[(ulong)UVar32 + 0x1c] = uVar5 - (uVar5 >> 5);
          if (uVar22 < 0x1000000) {
            uVar22 = uVar22 * 0x100;
            bVar23 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            uVar17 = uVar17 * 0x100 | (uint)bVar23;
          }
          uVar5 = pCVar7[(ulong)UVar32 + 0x28];
          uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
          uVar10 = uVar17 - uVar28;
          uVar18 = local_bc;
          if (uVar17 < uVar28) {
            pCVar7[(ulong)UVar32 + 0x28] = (short)(0x800 - uVar5 >> 5) + uVar5;
            local_bc = local_b8;
          }
          else {
            uVar22 = uVar22 - uVar28;
            pCVar7[(ulong)UVar32 + 0x28] = uVar5 - (uVar5 >> 5);
            if (uVar22 < 0x1000000) {
              uVar22 = uVar22 * 0x100;
              bVar23 = *pbVar29;
              pbVar29 = pbVar29 + 1;
              uVar10 = uVar10 * 0x100 | (uint)bVar23;
            }
            uVar5 = pCVar7[(ulong)UVar32 + 0x34];
            uVar28 = (uVar22 >> 0xb) * (uint)uVar5;
            uVar17 = uVar10 - uVar28;
            if (uVar10 < uVar28) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar17 = uVar10;
              uVar25 = local_c0;
            }
            else {
              uVar28 = uVar22 - uVar28;
              sVar33 = -(uVar5 >> 5);
              local_a0 = local_c0;
            }
            pCVar7[(ulong)UVar32 + 0x34] = sVar33 + uVar5;
            local_bc = uVar25;
            local_c0 = local_b8;
          }
        }
        UVar32 = (uint)(6 < UVar32) * 3 + 8;
        puVar15 = pCVar7 + -0x500;
        local_9c = local_bc;
      }
      uVar5 = *puVar15;
      if (uVar28 < 0x1000000) {
        uVar28 = uVar28 << 8;
        bVar23 = *pbVar29;
        pbVar29 = pbVar29 + 1;
        uVar17 = uVar17 << 8 | (uint)bVar23;
      }
      uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
      uVar19 = uVar17 - uVar22;
      if (uVar17 < uVar22) {
        *puVar15 = (short)(0x800 - uVar5 >> 5) + uVar5;
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 * 0x100;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar17 = uVar17 << 8 | (uint)bVar23;
        }
        uVar5 = puVar15[(ulong)uVar24 + 1];
        uVar19 = (uVar22 >> 0xb) * (uint)uVar5;
        uVar10 = uVar17 - uVar19;
        if (uVar17 < uVar19) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          lVar30 = 2;
          uVar10 = uVar17;
        }
        else {
          uVar19 = uVar22 - uVar19;
          sVar33 = -(uVar5 >> 5);
          lVar30 = 3;
        }
        puVar15[(ulong)uVar24 + 1] = sVar33 + uVar5;
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar10 = uVar10 << 8 | (uint)bVar23;
        }
        uVar5 = puVar15[(ulong)uVar24 + lVar30];
        uVar28 = (uVar19 >> 0xb) * (uint)uVar5;
        uVar25 = (int)lVar30 * 2;
        uVar17 = uVar10 - uVar28;
        if (uVar10 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar17 = uVar10;
        }
        else {
          uVar28 = uVar19 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar25 = uVar25 | 1;
        }
        puVar15[(ulong)uVar24 + lVar30] = sVar33 + uVar5;
        uVar5 = puVar15[(ulong)uVar24 + (ulong)uVar25];
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar17 = uVar17 << 8 | (uint)bVar23;
        }
        uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar19 = uVar25 * 2;
        uVar10 = uVar17 - uVar22;
        if (uVar17 < uVar22) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar10 = uVar17;
        }
        else {
          uVar22 = uVar28 - uVar22;
          sVar33 = -(uVar5 >> 5);
          uVar19 = uVar19 | 1;
        }
        puVar15[(ulong)uVar24 + (ulong)uVar25] = sVar33 + uVar5;
        uVar19 = uVar19 - 8;
      }
      else {
        uVar28 = uVar28 - uVar22;
        *puVar15 = uVar5 - (uVar5 >> 5);
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 * 0x100;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar19 = uVar19 * 0x100 | (uint)bVar23;
        }
        uVar5 = puVar15[8];
        uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar10 = uVar19 - uVar22;
        if (uVar19 < uVar22) {
          puVar15[8] = (short)(0x800 - uVar5 >> 5) + uVar5;
          if (uVar22 < 0x1000000) {
            uVar22 = uVar22 * 0x100;
            bVar23 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            uVar19 = uVar19 << 8 | (uint)bVar23;
          }
          uVar5 = puVar15[(ulong)uVar24 + 9];
          uVar25 = (uVar22 >> 0xb) * (uint)uVar5;
          uVar10 = uVar19 - uVar25;
          if (uVar19 < uVar25) {
            sVar33 = (short)(0x800 - uVar5 >> 5);
            uVar22 = 2;
            uVar10 = uVar19;
          }
          else {
            uVar25 = uVar22 - uVar25;
            sVar33 = -(uVar5 >> 5);
            uVar22 = 3;
          }
          puVar15[(ulong)uVar24 + 9] = sVar33 + uVar5;
          if (uVar25 < 0x1000000) {
            uVar25 = uVar25 << 8;
            bVar23 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            uVar10 = uVar10 << 8 | (uint)bVar23;
          }
          uVar5 = puVar15[(ulong)uVar24 + (ulong)uVar22 + 8];
          uVar28 = (uVar25 >> 0xb) * (uint)uVar5;
          uVar19 = uVar22 * 2;
          uVar17 = uVar10 - uVar28;
          if (uVar10 < uVar28) {
            sVar33 = (short)(0x800 - uVar5 >> 5);
            uVar17 = uVar10;
          }
          else {
            uVar28 = uVar25 - uVar28;
            sVar33 = -(uVar5 >> 5);
            uVar19 = uVar19 | 1;
          }
          puVar15[(ulong)uVar24 + (ulong)uVar22 + 8] = sVar33 + uVar5;
          uVar21 = (ulong)uVar19;
          uVar5 = puVar15[(ulong)uVar24 + uVar21 + 8];
          if (uVar28 < 0x1000000) {
            uVar28 = uVar28 << 8;
            bVar23 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            uVar17 = (uint)bVar23 | uVar17 << 8;
          }
          uVar22 = (uVar28 >> 0xb) * (uint)uVar5;
          uVar19 = uVar19 * 2;
          uVar10 = uVar17 - uVar22;
          if (uVar17 < uVar22) {
            puVar15[(ulong)uVar24 + uVar21 + 8] = (short)(0x800 - uVar5 >> 5) + uVar5;
            uVar10 = uVar17;
          }
          else {
            uVar22 = uVar28 - uVar22;
            puVar15[(ulong)uVar24 + uVar21 + 8] = uVar5 - (uVar5 >> 5);
            uVar19 = uVar19 | 1;
          }
        }
        else {
          uVar22 = uVar28 - uVar22;
          puVar15[8] = uVar5 - (uVar5 >> 5);
          uVar21 = 1;
          do {
            uVar25 = uVar22;
            uVar17 = uVar10;
            if (uVar22 < 0x1000000) {
              uVar25 = uVar22 << 8;
              bVar23 = *pbVar29;
              pbVar29 = pbVar29 + 1;
              uVar17 = uVar10 << 8 | (uint)bVar23;
            }
            uVar5 = puVar15[uVar21 + 0x100];
            uVar22 = (uVar25 >> 0xb) * (uint)uVar5;
            uVar19 = (int)uVar21 * 2;
            uVar10 = uVar17 - uVar22;
            if (uVar17 < uVar22) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar10 = uVar17;
            }
            else {
              uVar22 = uVar25 - uVar22;
              sVar33 = -(uVar5 >> 5);
              uVar19 = uVar19 | 1;
            }
            puVar15[uVar21 + 0x100] = sVar33 + uVar5;
            uVar21 = (ulong)uVar19;
          } while (uVar19 < 0x100);
          uVar19 = uVar19 - 0xf0;
        }
      }
      local_b8 = uVar18;
      if (0xb < UVar32) {
        uVar25 = 3;
        if (uVar19 < 3) {
          uVar25 = uVar19;
        }
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar10 = (uint)bVar23 | uVar10 << 8;
        }
        uVar21 = (ulong)(uVar25 << 7);
        uVar5 = *(ushort *)((long)pCVar7 + uVar21 + 0x82);
        uVar17 = (uVar22 >> 0xb) * (uint)uVar5;
        uVar25 = uVar10 - uVar17;
        if (uVar10 < uVar17) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar22 = 2;
          uVar25 = uVar10;
        }
        else {
          uVar17 = uVar22 - uVar17;
          sVar33 = -(uVar5 >> 5);
          uVar22 = 3;
        }
        lVar30 = uVar21 + 0x80;
        *(ushort *)((long)pCVar7 + uVar21 + 0x82) = sVar33 + uVar5;
        if (uVar17 < 0x1000000) {
          uVar17 = uVar17 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar25 = (uint)bVar23 | uVar25 << 8;
        }
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar22 * 2 + lVar30);
        uVar28 = (uVar17 >> 0xb) * (uint)uVar5;
        uVar10 = uVar22 * 2;
        uVar24 = uVar25 - uVar28;
        if (uVar25 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar25;
        }
        else {
          uVar28 = uVar17 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar22 * 2 + lVar30) = sVar33 + uVar5;
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar10 * 2 + lVar30);
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        uVar17 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar22 = uVar10 * 2;
        uVar25 = uVar24 - uVar17;
        if (uVar24 < uVar17) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar25 = uVar24;
        }
        else {
          uVar17 = uVar28 - uVar17;
          sVar33 = -(uVar5 >> 5);
          uVar22 = uVar22 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar10 * 2 + lVar30) = sVar33 + uVar5;
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar22 * 2 + lVar30);
        if (uVar17 < 0x1000000) {
          uVar17 = uVar17 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar25 = (uint)bVar23 | uVar25 << 8;
        }
        uVar28 = (uVar17 >> 0xb) * (uint)uVar5;
        uVar10 = uVar22 * 2;
        uVar24 = uVar25 - uVar28;
        if (uVar25 < uVar28) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar24 = uVar25;
        }
        else {
          uVar28 = uVar17 - uVar28;
          sVar33 = -(uVar5 >> 5);
          uVar10 = uVar10 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar22 * 2 + lVar30) = sVar33 + uVar5;
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar10 * 2 + lVar30);
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar24 = (uint)bVar23 | uVar24 << 8;
        }
        uVar31 = (uVar28 >> 0xb) * (uint)uVar5;
        uVar25 = uVar10 * 2;
        uVar17 = uVar24 - uVar31;
        if (uVar24 < uVar31) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar17 = uVar24;
        }
        else {
          uVar31 = uVar28 - uVar31;
          sVar33 = -(uVar5 >> 5);
          uVar25 = uVar25 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar10 * 2 + lVar30) = sVar33 + uVar5;
        uVar5 = *(ushort *)((long)pCVar7 + (ulong)uVar25 * 2 + lVar30);
        if (uVar31 < 0x1000000) {
          uVar31 = uVar31 << 8;
          bVar23 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar17 = (uint)bVar23 | uVar17 << 8;
        }
        uVar22 = (uVar31 >> 0xb) * (uint)uVar5;
        uVar24 = uVar25 * 2;
        uVar10 = uVar17 - uVar22;
        if (uVar17 < uVar22) {
          sVar33 = (short)(0x800 - uVar5 >> 5);
          uVar10 = uVar17;
        }
        else {
          uVar22 = uVar31 - uVar22;
          sVar33 = -(uVar5 >> 5);
          uVar24 = uVar24 | 1;
        }
        *(ushort *)((long)pCVar7 + (ulong)uVar25 * 2 + lVar30) = sVar33 + uVar5;
        uVar25 = uVar24 - 0x40;
        uVar21 = uVar20;
        if (3 < uVar25) {
          uVar17 = uVar24 & 1 | 2;
          if (uVar25 < 0xe) {
            iVar11 = (uVar25 >> 1) - 1;
            uVar25 = (uVar17 << ((byte)iVar11 & 0x1f)) + 1;
            iVar12 = 1;
            do {
              iVar26 = iVar12;
              uVar17 = uVar22;
              if (uVar22 < 0x1000000) {
                uVar17 = uVar22 << 8;
                bVar23 = *pbVar29;
                pbVar29 = pbVar29 + 1;
                uVar10 = uVar10 << 8 | (uint)bVar23;
              }
              uVar5 = pCVar7[(ulong)uVar25 - 0x680];
              uVar22 = (uVar17 >> 0xb) * (uint)uVar5;
              uVar24 = uVar10 - uVar22;
              if (uVar10 < uVar22) {
                sVar33 = (short)(0x800 - uVar5 >> 5);
                iVar12 = iVar26;
              }
              else {
                uVar22 = uVar17 - uVar22;
                sVar33 = -(uVar5 >> 5);
                uVar10 = uVar24;
                iVar12 = iVar26 * 2;
              }
              pCVar7[(ulong)uVar25 - 0x680] = sVar33 + uVar5;
              uVar25 = uVar25 + iVar12;
              iVar11 = iVar11 + -1;
              iVar12 = iVar26 * 2;
            } while (iVar11 != 0);
            uVar25 = uVar25 + iVar26 * -2;
          }
          else {
            iVar12 = (uVar25 >> 1) - 5;
            do {
              uVar25 = uVar22;
              if (uVar22 < 0x1000000) {
                bVar23 = *pbVar29;
                pbVar29 = pbVar29 + 1;
                uVar10 = (uint)bVar23 | uVar10 << 8;
                uVar25 = uVar22 << 8;
              }
              uVar22 = uVar25 >> 1;
              uVar24 = (int)(uVar10 - uVar22) >> 0x1f;
              uVar17 = uVar24 + uVar17 * 2 + 1;
              uVar10 = (uVar24 & uVar22) + (uVar10 - uVar22);
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
            if (uVar25 < 0x2000000) {
              uVar22 = uVar22 << 8;
              bVar23 = *pbVar29;
              pbVar29 = pbVar29 + 1;
              uVar10 = (uint)bVar23 | uVar10 * 0x100;
            }
            uVar5 = pCVar7[1];
            uVar24 = (uVar22 >> 0xb) * (uint)uVar5;
            uVar25 = uVar10 - uVar24;
            if (uVar10 < uVar24) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar22 = 2;
              uVar25 = uVar10;
            }
            else {
              uVar24 = uVar22 - uVar24;
              sVar33 = -(uVar5 >> 5);
              uVar22 = 3;
            }
            pCVar7[1] = sVar33 + uVar5;
            if (uVar24 < 0x1000000) {
              uVar24 = uVar24 << 8;
              bVar23 = *pbVar29;
              pbVar29 = pbVar29 + 1;
              uVar25 = (uint)bVar23 | uVar25 << 8;
            }
            uVar5 = pCVar7[uVar22];
            uVar28 = (uVar24 >> 0xb) * (uint)uVar5;
            uVar10 = uVar25 - uVar28;
            if (uVar25 < uVar28) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar24 = uVar22 + 2;
              uVar10 = uVar25;
            }
            else {
              uVar28 = uVar24 - uVar28;
              sVar33 = -(uVar5 >> 5);
              uVar24 = uVar22 + 4;
            }
            pCVar7[uVar22] = sVar33 + uVar5;
            uVar5 = pCVar7[uVar24];
            if (uVar28 < 0x1000000) {
              uVar28 = uVar28 << 8;
              bVar23 = *pbVar29;
              pbVar29 = pbVar29 + 1;
              uVar10 = (uint)bVar23 | uVar10 << 8;
            }
            uVar31 = (uVar28 >> 0xb) * (uint)uVar5;
            uVar25 = uVar10 - uVar31;
            if (uVar10 < uVar31) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              iVar12 = 4;
              uVar25 = uVar10;
            }
            else {
              uVar31 = uVar28 - uVar31;
              sVar33 = -(uVar5 >> 5);
              iVar12 = 8;
            }
            uVar28 = uVar24 + iVar12;
            pCVar7[uVar24] = sVar33 + uVar5;
            uVar5 = pCVar7[uVar28];
            if (uVar31 < 0x1000000) {
              uVar31 = uVar31 << 8;
              bVar23 = *pbVar29;
              pbVar29 = pbVar29 + 1;
              uVar25 = (uint)bVar23 | uVar25 << 8;
            }
            uVar22 = (uVar31 >> 0xb) * (uint)uVar5;
            uVar10 = uVar25 - uVar22;
            if (uVar25 < uVar22) {
              sVar33 = (short)(0x800 - uVar5 >> 5);
              uVar10 = uVar25;
              uVar25 = uVar28 - 8;
            }
            else {
              uVar22 = uVar31 - uVar22;
              sVar33 = -(uVar5 >> 5);
              uVar25 = uVar28;
            }
            uVar25 = uVar17 * 0x10 | uVar25;
            pCVar7[uVar28] = sVar33 + uVar5;
            if (uVar25 == 0xffffffff) {
              UVar32 = UVar32 - 0xc;
              uVar19 = 0x112;
              local_bc = local_9c;
LAB_0012be22:
              if (uVar22 < 0x1000000) {
                uVar22 = uVar22 << 8;
                bVar1 = *pbVar29;
                pbVar29 = pbVar29 + 1;
                uVar10 = (uint)bVar1 | uVar10 << 8;
              }
              p->buf = pbVar29;
              p->range = uVar22;
              p->code = uVar10;
              p->remainLen = uVar19;
              p->dicPos = uVar21;
              p->processedPos = UVar34;
              p->reps[0] = local_bc;
              p->reps[1] = local_b8;
              p->reps[2] = local_c0;
              p->reps[3] = local_a0;
              p->state = UVar32;
              if ((p->checkDicSize == 0) && (uVar6 = (p->prop).dicSize, uVar6 <= UVar34)) {
                p->checkDicSize = uVar6;
              }
              return (uint)(0x1ff < uVar19);
            }
          }
        }
        local_bc = uVar25 + 1;
        UVar32 = (uint)(0x12 < UVar32) * 3 + 7;
        uVar17 = uVar6;
        if (uVar6 == 0) {
          uVar17 = UVar34;
        }
        local_a0 = local_c0;
        if (uVar17 <= uVar25) {
          uVar19 = uVar19 + 0x202;
          local_b8 = local_9c;
          local_c0 = uVar18;
          goto LAB_0012be22;
        }
        local_b8 = local_9c;
        local_9c = local_bc;
        local_c0 = uVar18;
      }
      uVar19 = uVar19 + 2;
      uVar16 = local_78 - uVar20;
      uVar21 = local_78;
      local_bc = local_9c;
      if (uVar16 == 0) goto LAB_0012be22;
      uVar14 = uVar16 & 0xffffffff;
      if (uVar19 <= uVar16) {
        uVar14 = (ulong)uVar19;
      }
      uVar21 = 0;
      if (uVar20 < local_9c) {
        uVar21 = uVar9;
      }
      uVar21 = uVar21 + (uVar20 - local_9c);
      uVar19 = uVar19 - (int)uVar14;
      if (uVar9 - uVar21 < uVar14) {
        lVar30 = 0;
        do {
          pBVar8[lVar30 + uVar20] = pBVar8[uVar21];
          uVar21 = uVar21 + 1;
          if (uVar21 == uVar9) {
            uVar21 = 0;
          }
          lVar30 = lVar30 + 1;
        } while ((int)uVar14 != (int)lVar30);
        uVar21 = uVar20 + lVar30;
      }
      else {
        pBVar27 = pBVar8 + uVar20;
        uVar16 = uVar14;
        do {
          *pBVar27 = pBVar27[uVar21 - uVar20];
          pBVar27 = pBVar27 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
        uVar21 = uVar20 + uVar14;
      }
    }
    UVar34 = UVar34 + (int)uVar14;
    if ((local_78 <= uVar21) || (uVar20 = uVar21, bufLimit <= pbVar29)) goto LAB_0012be22;
  } while( true );
}

Assistant:

static int Z7_FASTCALL LzmaDec_DecodeReal2(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  if (p->checkDicSize == 0)
  {
    UInt32 rem = p->prop.dicSize - p->processedPos;
    if (limit - p->dicPos > rem)
      limit = p->dicPos + rem;
  }
  {
    int res = LZMA_DECODE_REAL(p, limit, bufLimit);
    if (p->checkDicSize == 0 && p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    return res;
  }
}